

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O3

int head_version(char *irafheader)

{
  int iVar1;
  int in_EDX;
  
  iVar1 = irafncmp(irafheader,"imhdr",in_EDX);
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    iVar1 = strncmp(irafheader,"imhv2",5);
    iVar1 = (uint)(iVar1 == 0) * 2;
  }
  return iVar1;
}

Assistant:

static int head_version (
    char *irafheader)	/* IRAF image header from file */

{

    /* Check header file magic word */
    if (irafncmp (irafheader, "imhdr", 5) != 0 ) {
	if (strncmp (irafheader, "imhv2", 5) != 0)
	    return (0);
	else
	    return (2);
	}
    else
	return (1);
}